

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifgetobj(bifcxdef *ctx,int argc)

{
  voccxdef *ctx_00;
  long lVar1;
  objnum *objlist;
  runcxdef *ctx_01;
  long in_RDI;
  voccxdef *voc;
  objnum obj;
  int id;
  int in_stack_ffffffffffffffcc;
  runcxdef *in_stack_ffffffffffffffd0;
  
  ctx_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x01') {
    objlist = *(objnum **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    ctx_01 = (runcxdef *)(ulong)((int)objlist - 1);
    switch(ctx_01) {
    case (runcxdef *)0x0:
      break;
    case (runcxdef *)0x1:
      break;
    case (runcxdef *)0x2:
      break;
    case (runcxdef *)0x3:
      break;
    case (runcxdef *)0x4:
      break;
    case (runcxdef *)0x5:
      break;
    case (runcxdef *)0x6:
      break;
    case (runcxdef *)0x7:
      break;
    case (runcxdef *)0x8:
      voc_push_objlist(ctx_00,objlist,0);
      return;
    default:
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "parserGetObj";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(ctx_01,in_stack_ffffffffffffffcc);
    }
    runpobj((runcxdef *)ctx_00,(objnum)((ulong)objlist >> 0x30));
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
}

Assistant:

void bifgetobj(bifcxdef *ctx, int argc)
{
    int id;
    objnum obj;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    /* check the argument count */
    bifcntargs(ctx, 1, argc);

    /* get the argument */
    id = (int)runpopnum(ctx->bifcxrun);

    /* get the appropriate object */
    switch(id)
    {
    case 1:
        /* get the current actor */
        obj = voc->voccxactor;

        /* if there's no current actor, use the current 'me' by default */
        if (obj == MCMONINV)
            obj = voc->voccxme;

        /* done */
        break;

    case 2:
        /* verb */
        obj = voc->voccxverb;
        break;

    case 3:
        /* direct object */
        obj = (voc->voccxdobj == 0 ? MCMONINV : voc->voccxdobj->vocolobj);
        break;

    case 4:
        /* preposition */
        obj = voc->voccxprep;
        break;

    case 5:
        /* indirect object */
        obj = (voc->voccxiobj == 0 ? MCMONINV : voc->voccxiobj->vocolobj);
        break;

    case 6:
        /* "it" */
        obj = voc->voccxit;
        break;

    case 7:
        /* "him" */
        obj = voc->voccxhim;
        break;

    case 8:
        /* "her" */
        obj = voc->voccxher;
        break;

    case 9:
        /* them */
        voc_push_objlist(voc, voc->voccxthm, voc->voccxthc);

        /* 
         *   return directly, since we've already pushed the result (it's
         *   a list, not an object) 
         */
        return;

    default:
        /* invalid argument */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "parserGetObj");
        break;
    }

    /* return the object */
    runpobj(ctx->bifcxrun, obj);
}